

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O3

void __thiscall cmCPackIFWInstaller::GeneratePackageFiles(cmCPackIFWInstaller *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *__s;
  _Rb_tree_node_base *p_Var3;
  size_t sVar4;
  cmCPackIFWPackage package;
  string local_220;
  cmCPackIFWPackage local_200;
  
  if (((this->Packages)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     (bVar2 = cmCPackIFWGenerator::IsOnePackage(this->Generator), bVar2)) {
    cmCPackIFWPackage::cmCPackIFWPackage(&local_200);
    local_200.Generator = this->Generator;
    paVar1 = &local_220.field_2;
    local_220._M_dataplus._M_p = (pointer)paVar1;
    local_200.Installer = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,"CPACK_IFW_PACKAGE_GROUP","");
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      __s = (char *)0x0;
    }
    else {
      __s = cmCPackGenerator::GetOption(&this->Generator->super_cmCPackGenerator,&local_220);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if (__s == (char *)0x0) {
      cmCPackIFWPackage::ConfigureFromOptions(&local_200);
    }
    else {
      local_220._M_dataplus._M_p = (pointer)paVar1;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,__s,__s + sVar4);
      cmCPackIFWPackage::ConfigureFromGroup(&local_200,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != paVar1) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_200.ForcedInstallation,0,
                 (char *)local_200.ForcedInstallation._M_string_length,0x4fcfcc);
    }
    cmCPackIFWPackage::GeneratePackageFile(&local_200);
    cmCPackIFWPackage::~cmCPackIFWPackage(&local_200);
  }
  else {
    for (p_Var3 = (this->Packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->Packages)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      cmCPackIFWPackage::GeneratePackageFile(*(cmCPackIFWPackage **)(p_Var3 + 2));
    }
  }
  return;
}

Assistant:

void cmCPackIFWInstaller::GeneratePackageFiles()
{
  if (Packages.empty() || Generator->IsOnePackage())
    {
    // Generate default package
    cmCPackIFWPackage package;
    package.Generator = Generator;
    package.Installer = this;
    // Check package group
    if (const char* option = GetOption("CPACK_IFW_PACKAGE_GROUP"))
      {
      package.ConfigureFromGroup(option);
      package.ForcedInstallation = "true";
      }
    else
      {
      package.ConfigureFromOptions();
      }
    package.GeneratePackageFile();
    return;
    }

  // Generate packages meta information
  for(PackagesMap::iterator pit = Packages.begin();
      pit != Packages.end(); ++pit)
    {
    cmCPackIFWPackage* package = pit->second;
    package->GeneratePackageFile();
  }
}